

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitio.cpp
# Opt level: O0

ssize_t __thiscall bitio::stream::read(stream *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  uint uVar2;
  byte local_2c;
  byte local_2a;
  char local_29;
  uint8_t rbits;
  uint8_t curr_byte;
  uint8_t nbits;
  stream *psStack_28;
  uint8_t nbytes;
  uint64_t value;
  uint8_t n_local;
  stream *this_local;
  
  if ((byte)__fd == 0) {
    this_local = (stream *)0x0;
  }
  else {
    local_29 = (char)((int)(__fd & 0xffU) >> 3);
    local_2a = (byte)__fd & 7;
    bVar1 = read_next_byte(this);
    local_2c = 8 - this->_bit_head;
    if (local_2c < local_2a) {
      uVar2 = (uint)(bVar1 & u8_rmasks[local_2c]);
      local_2a = local_2a - local_2c;
      local_2c = 0;
      this->_bit_head = '\b';
    }
    else {
      uVar2 = (int)(uint)(bVar1 & u8_rmasks[local_2c]) >> (local_2c - local_2a & 0x1f);
      this->_bit_head = this->_bit_head + local_2a;
      local_2c = local_2c - local_2a;
      local_2a = 0;
    }
    psStack_28 = (stream *)(long)(int)uVar2;
    if ((local_2c != 0) && (local_29 != '\0')) {
      local_29 = local_29 + -1;
      local_2a = 8 - local_2c;
      psStack_28 = (stream *)
                   ((long)(int)(uint)(bVar1 & u8_rmasks[local_2c]) +
                   ((long)psStack_28 << (local_2c & 0x3f)));
      this->_bit_head = '\b';
    }
    while (local_29 != '\0') {
      bVar1 = read_next_byte(this);
      psStack_28 = (stream *)((ulong)bVar1 + (long)psStack_28 * 0x100);
      this->_bit_head = '\b';
      local_29 = local_29 + -1;
    }
    if (local_2a != 0) {
      bVar1 = read_next_byte(this);
      psStack_28 = (stream *)
                   ((long)((int)(uint)bVar1 >> (8 - local_2a & 0x1f)) +
                   ((long)psStack_28 << (local_2a & 0x3f)));
      this->_bit_head = this->_bit_head + local_2a;
    }
    this_local = psStack_28;
  }
  return (ssize_t)this_local;
}

Assistant:

uint64_t bitio::stream::read(uint8_t n) {
    if (n == 0) {
        return 0;
    }

    uint64_t value = 0;
    uint8_t nbytes = n >> 3;
    uint8_t nbits = n & 0x7;

    // First, read the leftover bits.
    uint8_t curr_byte = read_next_byte();

    uint8_t rbits = 8 - _bit_head;

    if (nbits <= rbits) {
        value = (curr_byte & u8_rmasks[rbits]) >> (rbits - nbits);
        _bit_head += nbits;
        rbits -= nbits;
        nbits = 0;
    } else {
        value = curr_byte & u8_rmasks[rbits];
        nbits -= rbits;
        rbits = 0;
        _bit_head = 8;
    }

    // Now, if we need to read some nbytes and we have leftover rbits, we borrow a byte from the stream and
    // add the carry to nbits.

    if (rbits != 0) {
        if (nbytes != 0) {
            nbytes--;
            nbits = 8 - rbits;
            value <<= rbits;
            value += curr_byte & u8_rmasks[rbits];
            _bit_head = 8;
        }
    }

    // Now, read the nbytes.
    while (nbytes--) {
        value <<= 0x8;
        value += read_next_byte();
        _bit_head = 8;
    }

    // Read the remaining nbits. We don't need masks here because, bit_head is always 8 if nbits != 0
    if (nbits != 0) {
        curr_byte = read_next_byte();
        value <<= nbits;
        value += (curr_byte >> (8 - nbits));
        _bit_head += nbits;
    }

    return value;
}